

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

MYSQL_ROW one_query_row(char *query)

{
  MYSQL_RES *pMVar1;
  MYSQL_ROW ppcVar2;
  MYSQL_ROW row;
  MYSQL_RES *res_set;
  char *in_stack_fffffffffffffff0;
  
  pMVar1 = one_query_res(in_stack_fffffffffffffff0);
  ppcVar2 = (MYSQL_ROW)mysql_fetch_row(pMVar1);
  mysql_free_result(pMVar1);
  return ppcVar2;
}

Assistant:

MYSQL_ROW one_query_row(char *query)
{
	MYSQL_RES *res_set;
	MYSQL_ROW row;

	res_set = one_query_res(query);
	row = mysql_fetch_row(res_set);
	mysql_free_result(res_set);
	return row;
}